

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

int run_container_get_index(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  _Bool _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  _Var3 = run_container_contains(container,x);
  if (_Var3) {
    uVar6 = 0;
    uVar5 = (ulong)(uint)container->n_runs;
    if (container->n_runs < 1) {
      uVar5 = uVar6;
    }
    iVar4 = 0;
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = container->runs[uVar6].value;
      uVar2 = container->runs[uVar6].length;
      if ((uint)x <= (uint)uVar2 + (uint)uVar1) {
        if (uVar1 <= x) {
          return (iVar4 + (uint)x) - (uint)uVar1;
        }
        break;
      }
      iVar4 = iVar4 + (uint)uVar2 + 1;
    }
    iVar4 = iVar4 + -1;
  }
  else {
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int run_container_get_index(const run_container_t *container, uint16_t x) {
    if (run_container_contains(container, x)) {
        int sum = 0;
        uint32_t x32 = x;
        for (int i = 0; i < container->n_runs; i++) {
            uint32_t startpoint = container->runs[i].value;
            uint32_t length = container->runs[i].length;
            uint32_t endpoint = length + startpoint;
            if (x <= endpoint) {
                if (x < startpoint) break;
                return sum + (x32 - startpoint);
            } else {
                sum += length + 1;
            }
        }
        return sum - 1;
    } else {
        return -1;
    }
}